

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

void Validator::printEvaluation(Solution *solution)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"S1 : ");
  constraintS1(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  constraintS1(solution);
  poVar1 = std::operator<<((ostream *)&std::cout,"S2 : ");
  constraintS2(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  constraintS2(solution);
  poVar1 = std::operator<<((ostream *)&std::cout,"S3 : ");
  constraintS3(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  constraintS3(solution);
  poVar1 = std::operator<<((ostream *)&std::cout,"S4 : ");
  constraintS4(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  constraintS4(solution);
  poVar1 = std::operator<<((ostream *)&std::cout,"S5 : ");
  constraintS5(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  constraintS5(solution);
  poVar1 = std::operator<<((ostream *)&std::cout,"S6 : ");
  constraintS6(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  constraintS6(solution);
  poVar1 = std::operator<<((ostream *)&std::cout,"S7 : ");
  constraintS7(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  constraintS7(solution);
  poVar1 = std::operator<<((ostream *)&std::cout,"Sum : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Validator::printEvaluation(const Solution &solution){
    unsigned int sum = 0;

    cout << "S1 : " << constraintS1(solution) << endl;
    sum += constraintS1(solution);
    cout << "S2 : " << constraintS2(solution) << endl;
    sum += constraintS2(solution);
    cout << "S3 : " << constraintS3(solution) << endl;
    sum += constraintS3(solution);
    cout << "S4 : " << constraintS4(solution) << endl;
    sum += constraintS4(solution);
    cout << "S5 : " << constraintS5(solution) << endl;
    sum += constraintS5(solution);
    cout << "S6 : " << constraintS6(solution) << endl;
    sum += constraintS6(solution);
    cout << "S7 : " << constraintS7(solution) << endl;
    sum += constraintS7(solution);


    cout << "Sum : " << sum << endl;
}